

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshm-posix.c
# Opt level: O1

void pp_shm_clean_handle(PShm *shm)

{
  int iVar1;
  
  if (shm->addr != (void *)0x0) {
    iVar1 = munmap(shm->addr,shm->size);
    if (iVar1 == -1) {
      printf("** Error: %s **\n","PShm::pp_shm_clean_handle: munmap () failed");
    }
  }
  if (shm->shm_created == 1) {
    iVar1 = shm_unlink(shm->platform_key);
    if (iVar1 == -1) {
      printf("** Error: %s **\n","PShm::pp_shm_clean_handle: shm_unlink() failed");
    }
  }
  if (shm->sem != (PSemaphore *)0x0) {
    p_semaphore_free(shm->sem);
    shm->sem = (PSemaphore *)0x0;
  }
  shm->shm_created = 0;
  shm->addr = (ppointer)0x0;
  shm->size = 0;
  return;
}

Assistant:

static void
pp_shm_clean_handle (PShm *shm)
{
	if (P_UNLIKELY (shm->addr != NULL && munmap (shm->addr, shm->size) == -1))
		P_ERROR ("PShm::pp_shm_clean_handle: munmap () failed");

	if (shm->shm_created == TRUE && shm_unlink (shm->platform_key) == -1)
		P_ERROR ("PShm::pp_shm_clean_handle: shm_unlink() failed");

	if (P_LIKELY (shm->sem != NULL)) {
		p_semaphore_free (shm->sem);
		shm->sem         = NULL;
	}

	shm->shm_created = FALSE;
	shm->addr        = NULL;
	shm->size        = 0;
}